

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
test_ethash_io_memo_file_size_mismatch::test_method(test_ethash_io_memo_file_size_mismatch *this)

{
  ethash_h256_t seedhash_00;
  ethash_h256_t seedhash_01;
  uint64_t uVar1;
  bool bVar2;
  undefined1 pv_;
  lazy_ostream *plVar3;
  lazy_ostream *prev;
  uint64_t in_stack_fffffffffffffcc0;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffd08;
  uint64_t in_stack_fffffffffffffd10;
  uint64_t file_size;
  FILE **in_stack_fffffffffffffd18;
  basic_cstring<const_char> *this_00;
  char *in_stack_fffffffffffffd20;
  basic_cstring<const_char> *this_01;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  undefined8 in_stack_fffffffffffffd38;
  uint64_t uVar5;
  undefined8 in_stack_fffffffffffffd40;
  basic_cstring<const_char> *this_02;
  undefined8 in_stack_fffffffffffffd48;
  basic_cstring<const_char> *this_03;
  path local_278;
  FILE *local_258;
  uint8_t auStack_250 [8];
  uint8_t local_248 [8];
  uint8_t auStack_240 [8];
  ethash_io_rc local_238 [2];
  basic_cstring<const_char> local_230;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_220;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  path local_198;
  assertion_result local_178;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_120;
  assertion_result local_100;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  FILE *local_c8;
  uint8_t auStack_c0 [8];
  uint8_t local_b8 [8];
  uint8_t auStack_b0 [12];
  ethash_io_rc local_a4 [5];
  basic_cstring<const_char> local_90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_80;
  basic_cstring<const_char> local_58;
  basic_cstring<const_char> local_48;
  FILE *local_38;
  FILE *f;
  ethash_h256_t seedhash;
  test_ethash_io_memo_file_size_mismatch *this_local;
  
  seedhash.b._24_8_ = this;
  ethash_get_seedhash(in_stack_fffffffffffffcc0);
  local_38 = (FILE *)0x0;
  do {
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_48,0x115,&local_58);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_80,plVar3,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    local_a4[1] = 2;
    local_b8[0] = seedhash.b[8];
    local_b8[1] = seedhash.b[9];
    local_b8[2] = seedhash.b[10];
    local_b8[3] = seedhash.b[0xb];
    local_b8[4] = seedhash.b[0xc];
    local_b8[5] = seedhash.b[0xd];
    local_b8[6] = seedhash.b[0xe];
    local_b8[7] = seedhash.b[0xf];
    auStack_b0[0] = seedhash.b[0x10];
    auStack_b0[1] = seedhash.b[0x11];
    auStack_b0[2] = seedhash.b[0x12];
    auStack_b0[3] = seedhash.b[0x13];
    auStack_b0[4] = seedhash.b[0x14];
    auStack_b0[5] = seedhash.b[0x15];
    auStack_b0[6] = seedhash.b[0x16];
    auStack_b0[7] = seedhash.b[0x17];
    local_c8 = f;
    auStack_c0[0] = seedhash.b[0];
    auStack_c0[1] = seedhash.b[1];
    auStack_c0[2] = seedhash.b[2];
    auStack_c0[3] = seedhash.b[3];
    auStack_c0[4] = seedhash.b[4];
    auStack_c0[5] = seedhash.b[5];
    auStack_c0[6] = seedhash.b[6];
    auStack_c0[7] = seedhash.b[7];
    seedhash_00.b[7] = in_stack_fffffffffffffd37;
    seedhash_00.b[0] = (char)in_stack_fffffffffffffd30;
    seedhash_00.b[1] = (char)((uint7)in_stack_fffffffffffffd30 >> 8);
    seedhash_00.b[2] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x10);
    seedhash_00.b[3] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x18);
    seedhash_00.b[4] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x20);
    seedhash_00.b[5] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x28);
    seedhash_00.b[6] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x30);
    seedhash_00.b[8] = (char)in_stack_fffffffffffffd38;
    seedhash_00.b[9] = (char)((ulong)in_stack_fffffffffffffd38 >> 8);
    seedhash_00.b[10] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x10);
    seedhash_00.b[0xb] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x18);
    seedhash_00.b[0xc] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    seedhash_00.b[0xd] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x28);
    seedhash_00.b[0xe] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x30);
    seedhash_00.b[0xf] = (char)((ulong)in_stack_fffffffffffffd38 >> 0x38);
    seedhash_00.b[0x10] = (char)in_stack_fffffffffffffd40;
    seedhash_00.b[0x11] = (char)((ulong)in_stack_fffffffffffffd40 >> 8);
    seedhash_00.b[0x12] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x10);
    seedhash_00.b[0x13] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x18);
    seedhash_00.b[0x14] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x20);
    seedhash_00.b[0x15] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x28);
    seedhash_00.b[0x16] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x30);
    seedhash_00.b[0x17] = (char)((ulong)in_stack_fffffffffffffd40 >> 0x38);
    seedhash_00.b[0x18] = (char)in_stack_fffffffffffffd48;
    seedhash_00.b[0x19] = (char)((ulong)in_stack_fffffffffffffd48 >> 8);
    seedhash_00.b[0x1a] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x10);
    seedhash_00.b[0x1b] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x18);
    seedhash_00.b[0x1c] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    seedhash_00.b[0x1d] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x28);
    seedhash_00.b[0x1e] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x30);
    seedhash_00.b[0x1f] = (char)((ulong)in_stack_fffffffffffffd48 >> 0x38);
    uVar4 = seedhash.b._16_8_;
    local_a4[0] = ethash_io_prepare(in_stack_fffffffffffffd20,seedhash_00,in_stack_fffffffffffffd18,
                                    in_stack_fffffffffffffd10,
                                    SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
              (&local_80,&local_90,0x115,2,2,local_a4 + 1,"ETHASH_IO_MEMO_MISMATCH",local_a4,
               "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)",uVar4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_80);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    this_02 = &local_d8;
    uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_02,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    this_03 = &local_e8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(this_03);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,this_02,0x116,this_03);
    boost::test_tools::assertion_result::assertion_result<_IO_FILE*>
              (&local_100,(_IO_FILE **)&local_38);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>(&local_130,"f",1);
    boost::unit_test::operator<<(&local_120,plVar3,&local_130);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_100,&local_120,&local_140,0x116,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  fclose(local_38);
  do {
    this_00 = &local_150;
    file_size = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    this_01 = &local_160;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(this_01);
    boost::unit_test::unit_test_log_t::set_checkpoint(file_size,this_00,0x11a,this_01);
    boost::filesystem::path::path(&local_198,"./test_ethash_directory/");
    pv_ = boost::filesystem::is_directory(&local_198);
    boost::test_tools::assertion_result::assertion_result(&local_178,(bool)pv_);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"fs::is_directory(fs::path(\"./test_ethash_directory/\"))",0x36);
    boost::unit_test::operator<<(&local_1b8,plVar3,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_178,&local_1b8,&local_1d8,0x11a,2,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_178);
    boost::filesystem::path::~path(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x11f,&local_1f8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_220,prev,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    local_238[1] = 1;
    local_248[0] = seedhash.b[8];
    local_248[1] = seedhash.b[9];
    local_248[2] = seedhash.b[10];
    local_248[3] = seedhash.b[0xb];
    local_248[4] = seedhash.b[0xc];
    local_248[5] = seedhash.b[0xd];
    local_248[6] = seedhash.b[0xe];
    local_248[7] = seedhash.b[0xf];
    auStack_240[0] = seedhash.b[0x10];
    auStack_240[1] = seedhash.b[0x11];
    auStack_240[2] = seedhash.b[0x12];
    auStack_240[3] = seedhash.b[0x13];
    auStack_240[4] = seedhash.b[0x14];
    auStack_240[5] = seedhash.b[0x15];
    auStack_240[6] = seedhash.b[0x16];
    auStack_240[7] = seedhash.b[0x17];
    local_258 = f;
    auStack_250[0] = seedhash.b[0];
    auStack_250[1] = seedhash.b[1];
    auStack_250[2] = seedhash.b[2];
    auStack_250[3] = seedhash.b[3];
    auStack_250[4] = seedhash.b[4];
    auStack_250[5] = seedhash.b[5];
    auStack_250[6] = seedhash.b[6];
    auStack_250[7] = seedhash.b[7];
    seedhash_01.b[7] = pv_;
    seedhash_01.b[0] = (char)in_stack_fffffffffffffd30;
    seedhash_01.b[1] = (char)((uint7)in_stack_fffffffffffffd30 >> 8);
    seedhash_01.b[2] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x10);
    seedhash_01.b[3] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x18);
    seedhash_01.b[4] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x20);
    seedhash_01.b[5] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x28);
    seedhash_01.b[6] = (char)((uint7)in_stack_fffffffffffffd30 >> 0x30);
    seedhash_01.b[8] = (char)uVar5;
    seedhash_01.b[9] = (char)(uVar5 >> 8);
    seedhash_01.b[10] = (char)(uVar5 >> 0x10);
    seedhash_01.b[0xb] = (char)(uVar5 >> 0x18);
    seedhash_01.b[0xc] = (char)(uVar5 >> 0x20);
    seedhash_01.b[0xd] = (char)(uVar5 >> 0x28);
    seedhash_01.b[0xe] = (char)(uVar5 >> 0x30);
    seedhash_01.b[0xf] = (char)(uVar5 >> 0x38);
    seedhash_01.b._16_8_ = this_02;
    seedhash_01.b._24_8_ = this_03;
    uVar4 = seedhash.b._16_8_;
    local_238[0] = ethash_io_prepare((char *)this_01,seedhash_01,(FILE **)this_00,file_size,
                                     SUB81((ulong)plVar3 >> 0x38,0));
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ethash_io_rc,ethash_io_rc>
              (&local_220,&local_230,0x11f,2,2,local_238 + 1,"ETHASH_IO_MEMO_SIZE_MISMATCH",
               local_238,"ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 65, false)",
               uVar4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::filesystem::path::path(&local_278,"./test_ethash_directory/");
  boost::filesystem::remove_all(&local_278);
  boost::filesystem::path::~path(&local_278);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_size_mismatch) {
	static const int blockn = 0;
	ethash_h256_t seedhash = ethash_get_seedhash(blockn);
	FILE *f = NULL;
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);
	fclose(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// and check that we get the size mismatch detected if we request diffferent size
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_SIZE_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 65, false)
	);

	// cleanup
	fs::remove_all("./test_ethash_directory/");
}